

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

FName __thiscall AActor::GetSpecies(AActor *this)

{
  byte bVar1;
  PClass *pPVar2;
  int iVar3;
  PClass *pPVar4;
  PClass *pPVar5;
  DObject *in_RSI;
  
  iVar3 = *(int *)((long)&in_RSI[0xe].Class + 4);
  if (iVar3 == 0) {
    pPVar4 = DObject::GetClass(in_RSI);
    bVar1 = pPVar4->Defaults[0x195];
    pPVar5 = pPVar4;
    while ((pPVar2 = pPVar4, (bVar1 & 0x20) != 0 &&
           (pPVar4 = pPVar2->ParentClass, pPVar5 = pPVar2, pPVar4 != (PClass *)0x0))) {
      bVar1 = pPVar4->Defaults[0x195];
    }
    iVar3 = (pPVar5->super_PStruct).super_PNamedType.TypeName.Index;
    *(int *)((long)&in_RSI[0xe].Class + 4) = iVar3;
  }
  *(int *)&(this->super_DThinker).super_DObject._vptr_DObject = iVar3;
  return (FName)(int)this;
}

Assistant:

FName AActor::GetSpecies()
{
	if (Species != NAME_None)
	{
		return Species;
	}

	PClassActor *thistype = GetClass();

	if (GetDefaultByType(thistype)->flags3 & MF3_ISMONSTER)
	{
		while (thistype->ParentClass)
		{
			if (GetDefaultByType(thistype->ParentClass)->flags3 & MF3_ISMONSTER)
				thistype = static_cast<PClassActor *>(thistype->ParentClass);
			else 
				break;
		}
	}
	return Species = thistype->TypeName; // [GZ] Speeds up future calls.
}